

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DatatypeValidator::serialize(DatatypeValidator *this,XSerializeEngine *serEng)

{
  bool bVar1;
  DatatypeValidator *pDVar2;
  RegularExpression *this_00;
  undefined1 local_78 [8];
  ArrayJanitor<char16_t> janUri;
  XMLCh *typeUri;
  ArrayJanitor<char16_t> janName_1;
  XMLCh *typeLocalName_1;
  undefined1 local_38 [8];
  ArrayJanitor<char16_t> janName;
  XMLCh *typeLocalName;
  int flag;
  int type;
  XSerializeEngine *serEng_local;
  DatatypeValidator *this_local;
  
  _flag = serEng;
  serEng_local = (XSerializeEngine *)this;
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(_flag,(bool)(this->fAnonymous & 1));
    XSerializeEngine::operator<<(_flag,(bool)(this->fFinite & 1));
    XSerializeEngine::operator<<(_flag,(bool)(this->fBounded & 1));
    XSerializeEngine::operator<<(_flag,(bool)(this->fNumeric & 1));
    XSerializeEngine::operator<<(_flag,this->fWhiteSpace);
    XSerializeEngine::operator<<(_flag,this->fFinalSet);
    XSerializeEngine::operator<<(_flag,this->fFacetsDefined);
    XSerializeEngine::operator<<(_flag,this->fFixed);
    XSerializeEngine::operator<<(_flag,this->fType);
    XSerializeEngine::operator<<(_flag,this->fOrdered);
    storeDV(_flag,this->fBaseValidator);
    XTemplateSerializer::storeObject(this->fFacets,_flag);
    XSerializeEngine::writeString(_flag,this->fPattern,0,false);
    if (this->fTypeUri == L"") {
      XSerializeEngine::operator<<(_flag,-1);
    }
    else if (this->fTypeUri == (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      XSerializeEngine::operator<<(_flag,-2);
      XSerializeEngine::writeString(_flag,this->fTypeLocalName,0,false);
    }
    else {
      XSerializeEngine::operator<<(_flag,-3);
      XSerializeEngine::writeString(_flag,this->fTypeLocalName,0,false);
      XSerializeEngine::writeString(_flag,this->fTypeUri,0,false);
    }
  }
  else {
    XSerializeEngine::operator>>(_flag,&this->fAnonymous);
    XSerializeEngine::operator>>(_flag,&this->fFinite);
    XSerializeEngine::operator>>(_flag,&this->fBounded);
    XSerializeEngine::operator>>(_flag,&this->fNumeric);
    XSerializeEngine::operator>>(_flag,&this->fWhiteSpace);
    XSerializeEngine::operator>>(_flag,&this->fFinalSet);
    XSerializeEngine::operator>>(_flag,&this->fFacetsDefined);
    XSerializeEngine::operator>>(_flag,&this->fFixed);
    XSerializeEngine::operator>>(_flag,(int *)((long)&typeLocalName + 4));
    this->fType = typeLocalName._4_4_;
    XSerializeEngine::operator>>(_flag,(int *)((long)&typeLocalName + 4));
    this->fOrdered = typeLocalName._4_4_;
    pDVar2 = loadDV(_flag);
    this->fBaseValidator = pDVar2;
    XTemplateSerializer::loadObject(&this->fFacets,0x1d,true,_flag);
    XSerializeEngine::readString(_flag,&this->fPattern);
    XSerializeEngine::operator>>(_flag,(int *)&typeLocalName);
    if ((int)typeLocalName == -1) {
      setTypeName(this,(XMLCh *)0x0);
    }
    else if ((int)typeLocalName == -2) {
      XSerializeEngine::readString(_flag,(XMLCh **)&janName.fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)local_38,(char16_t *)janName.fMemoryManager,
                 this->fMemoryManager);
      setTypeName(this,(XMLCh *)janName.fMemoryManager);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_38);
    }
    else {
      XSerializeEngine::readString(_flag,(XMLCh **)&janName_1.fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)&typeUri,(char16_t *)janName_1.fMemoryManager,
                 this->fMemoryManager);
      XSerializeEngine::readString(_flag,(XMLCh **)&janUri.fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)local_78,(char16_t *)janUri.fMemoryManager,
                 this->fMemoryManager);
      setTypeName(this,(XMLCh *)janName_1.fMemoryManager,(XMLCh *)janUri.fMemoryManager);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_78);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&typeUri);
    }
    this_00 = (RegularExpression *)XMemory::operator_new(0x70,this->fMemoryManager);
    RegularExpression::RegularExpression(this_00,this->fPattern,L"X",this->fMemoryManager);
    this->fRegex = this_00;
  }
  return;
}

Assistant:

void DatatypeValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fAnonymous;
        serEng<<fFinite;
        serEng<<fBounded;
        serEng<<fNumeric;

        serEng<<fWhiteSpace;
        serEng<<fFinalSet;
        serEng<<fFacetsDefined;
        serEng<<fFixed;

        serEng<<(int)fType;
        serEng<<(int)fOrdered;

        storeDV(serEng, fBaseValidator);

        /***
         *  Serialize RefHashTableOf<KVStringPair>
         ***/
        XTemplateSerializer::storeObject(fFacets, serEng);

        serEng.writeString(fPattern);

        if (fTypeUri==XMLUni::fgZeroLenString)
        {
            serEng<<TYPENAME_ZERO;
        }
        else if (fTypeUri == SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        {
            serEng<<TYPENAME_S4S;
            serEng.writeString(fTypeLocalName);
        }
        else
        {        
            serEng<<TYPENAME_NORMAL;
            serEng.writeString(fTypeLocalName);
            serEng.writeString(fTypeUri);
        }

        /***
         * don't serialize 
         *       fRegex
         ***/    
    }
    else
    {
        serEng>>fAnonymous;
        serEng>>fFinite;
        serEng>>fBounded;
        serEng>>fNumeric;

        serEng>>fWhiteSpace;
        serEng>>fFinalSet;
        serEng>>fFacetsDefined;
        serEng>>fFixed;

        int type;
        serEng>>type;
        fType=(ValidatorType)type;

        serEng>>type;
        fOrdered = (XSSimpleTypeDefinition::ORDERING)type;


        fBaseValidator = loadDV(serEng);

        /***
         *
         *  Deserialize RefHashTableOf<KVStringPair>
         *
         ***/
        XTemplateSerializer::loadObject(&fFacets, 29, true, serEng);
        serEng.readString(fPattern);       

        /***
         *   Recreate through setTypeName()
         *       fTypeName
         ***/

        int flag;
        serEng>>flag;

        if ( TYPENAME_ZERO == flag )
        {
            setTypeName(0);
        }
        else if ( TYPENAME_S4S == flag )
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            setTypeName(typeLocalName);
        }
        else // TYPENAME_NORMAL
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            XMLCh* typeUri;
            serEng.readString(typeUri);
            ArrayJanitor<XMLCh> janUri(typeUri, fMemoryManager);

            setTypeName(typeLocalName, typeUri);
        }

        /***
         * don't serialize fRegex
         ***/
        fRegex = new (fMemoryManager) RegularExpression(fPattern, SchemaSymbols::fgRegEx_XOption, fMemoryManager);

    }

}